

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall
UI::renderMessages(UI *this,
                  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *messages,
                  int width,bool isThread)

{
  int *piVar1;
  pointer pUVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ImU32 col;
  int iVar9;
  ImDrawList *this_00;
  ImGuiIO *pIVar10;
  pointer pMVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  ulong uVar13;
  pointer pMVar14;
  ulong uVar15;
  long lVar16;
  pointer pMVar17;
  float fVar18;
  uint uVar19;
  ImVec2 IVar20;
  uint uVar21;
  ulong uVar22;
  ImVec2 IVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  string curDate;
  ImVec2 p0;
  ImVec2 p1;
  string lastDate;
  ImVec2 local_110;
  undefined1 local_108 [8];
  size_t local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  ImVec2 local_e8;
  UI *local_e0;
  undefined4 local_d4;
  ImVec4 *local_d0;
  float local_c8;
  int local_c4;
  ImVec2 local_c0;
  ImVec2 local_b8;
  undefined8 uStack_b0;
  ImVec4 *local_a0;
  ImVec2 local_98;
  float local_8c;
  undefined1 local_88 [16];
  ImVec4 *local_78;
  ImVec4 *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ImVec4 *local_48;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *local_40;
  long local_38;
  
  local_d4 = (undefined4)CONCAT71(in_register_00000009,isThread);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_e0 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"","");
  ImGui::PushTextWrapPos((float)(width + -4));
  pMVar17 = (messages->super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(messages->
                              super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar17) >> 3) *
          0x38e38e39) {
    if ((char)local_d4 == '\0') {
      local_c8 = 12.0;
    }
    else {
      local_c8 = 7.0;
    }
    local_c4 = width / 2;
    local_a0 = &(local_e0->colors).messageUser;
    local_78 = &(local_e0->colors).messageTime;
    local_8c = (float)width;
    local_d0 = &(local_e0->colors).messageReact;
    local_70 = &(local_e0->colors).messageReplies;
    local_48 = &(local_e0->colors).messageHovered;
    fVar18 = -NAN;
    IVar23.x = 0.0;
    IVar23.y = 0.0;
    local_40 = messages;
    do {
      iVar9 = pMVar17[(long)IVar23].msg.uid;
      pUVar2 = (local_e0->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
               super__Vector_impl_data._M_start;
      ImGui::PushID((int)IVar23.x);
      pMVar17 = pMVar17 + (long)IVar23;
      local_38 = (long)IVar23 * 9;
      tToDate_abi_cxx11_((string *)local_108,(pMVar17->msg).t_s);
      sVar3 = local_100;
      IVar20 = (ImVec2)local_108;
      local_b8.x = fVar18;
      if (local_100 == local_68._M_string_length) {
        if (local_100 != 0) {
          iVar7 = bcmp((void *)local_108,local_68._M_dataplus._M_p,local_100);
          if (iVar7 != 0) goto LAB_0011647a;
        }
      }
      else {
LAB_0011647a:
        ImGui::Text("%s","");
        local_88._0_8_ = pMVar17;
        uVar21 = ~(uint)(sVar3 + 6 >> 1) + local_c4;
        uVar8 = 0xff;
        if ((int)uVar21 < 0xff) {
          uVar8 = uVar21;
        }
        uVar19 = 0;
        if (0 < (int)uVar8) {
          uVar19 = uVar8;
        }
        if (0 < (int)uVar21) {
          memset(renderSeparator::buf,0x2d,(ulong)uVar8);
        }
        renderSeparator::buf[uVar19] = '\0';
        ImGui::TextDisabled("%s%s%s","",renderSeparator::buf);
        pMVar17 = (pointer)local_88._0_8_;
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",local_108);
        ImGui::SameLine(0.0,-1.0);
        if (0 < (int)uVar21) {
          memset(renderSeparator::buf,0x2d,(ulong)uVar8);
        }
        renderSeparator::buf[uVar19] = '\0';
        ImGui::TextDisabled("%s%s%s","",renderSeparator::buf);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
        IVar20 = (ImVec2)local_108;
      }
      if (IVar20 != (ImVec2)&local_f8) {
        operator_delete((void *)IVar20,local_f8._M_allocated_capacity + 1);
      }
      IVar20 = ImGui::GetCursorScreenPos();
      local_88._8_4_ = extraout_XMM0_Dc;
      local_88._0_4_ = IVar20.x;
      local_88._4_4_ = IVar20.y;
      local_88._12_4_ = extraout_XMM0_Dd;
      IVar20 = ImGui::GetCursorScreenPos();
      local_e8.y = IVar20.y;
      fVar18 = local_b8.x;
      local_e8.x = (float)local_88._0_4_;
      if (local_b8.x != (float)(pMVar17->msg).uid) {
        ImGui::Text("%s","");
        ImGui::TextColored(local_a0,"%s",pUVar2[iVar9].username._M_dataplus._M_p);
        ImGui::SameLine(0.0,-1.0);
        tToTime_abi_cxx11_((string *)local_108,(pMVar17->msg).t_s);
        ImGui::TextColored(local_78,"%s",local_108);
        if (local_108 != (undefined1  [8])&local_f8) {
          operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
        }
      }
      ImGui::Text("%s",(pMVar17->msg).text._M_dataplus._M_p);
      if (0 < (pMVar17->msg).reactUp) {
        ImGui::TextColored(local_d0,"%s","[+]");
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%d",(ulong)(uint)(pMVar17->msg).reactUp);
      }
      if (0 < (pMVar17->msg).reactDown) {
        if (0 < (pMVar17->msg).reactUp) {
          ImGui::SameLine(0.0,-1.0);
        }
        ImGui::TextColored(local_d0,"%s","[-]");
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%d",(ulong)(uint)(pMVar17->msg).reactDown);
      }
      pMVar14 = (pMVar17->replies).
                super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
                super__Vector_impl_data._M_start;
      pMVar11 = *(pointer *)
                 ((long)&(pMVar17->replies).
                         super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                         ._M_impl + 8);
      if (pMVar11 != pMVar14) {
        if ((0 < (pMVar17->msg).reactUp) || (0 < (pMVar17->msg).reactDown)) {
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("|");
          ImGui::SameLine(0.0,-1.0);
          pMVar14 = (pMVar17->replies).
                    super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar11 = *(pointer *)
                     ((long)&(pMVar17->replies).
                             super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                             ._M_impl + 8);
        }
        ImGui::TextColored(local_70,"%d replies",
                           (ulong)(uint)((int)((ulong)((long)pMVar11 - (long)pMVar14) >> 3) *
                                        0x38e38e39));
      }
      IVar20 = ImGui::GetCursorScreenPos();
      local_88._8_4_ = extraout_XMM0_Dc_00;
      local_88._0_4_ = IVar20.x;
      local_88._4_4_ = IVar20.y;
      local_88._12_4_ = extraout_XMM0_Dd_00;
      IVar20 = ImGui::GetCursorScreenPos();
      local_c0.y = IVar20.y;
      local_c0.x = (float)local_88._0_4_ + local_8c;
      bVar4 = ImGui::IsWindowHovered(0);
      if (bVar4) {
        bVar4 = ImGui::IsMouseHoveringRect(&local_e8,&local_c0,true);
        if (bVar4) {
          this_00 = ImGui::GetWindowDrawList();
          local_108._4_4_ = local_e8.y + 1.0;
          local_108._0_4_ = local_e8.x;
          local_110.y = local_c0.y + -1.0;
          local_110.x = local_c0.x;
          col = ImGui::ColorConvertFloat4ToU32(local_48);
          ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_108,&local_110,col,0.0,0xf);
          ImGui::SetCursorScreenPos(&local_e8);
          if (fVar18 != (float)(pMVar17->msg).uid) {
            ImGui::Text("%s","");
            ImGui::TextColored(local_a0,"%s",pUVar2[iVar9].username._M_dataplus._M_p);
            ImGui::SameLine(0.0,-1.0);
            tToTime_abi_cxx11_((string *)local_108,(pMVar17->msg).t_s);
            ImGui::TextColored(local_78,"%s",local_108);
            if (local_108 != (undefined1  [8])&local_f8) {
              operator_delete((void *)local_108,local_f8._M_allocated_capacity + 1);
            }
          }
          ImGui::Text("%s");
          if (0 < (pMVar17->msg).reactUp) {
            ImGui::TextColored(local_d0,"%s","[+]");
            bVar4 = ImGui::IsItemHovered(0);
            if (bVar4) {
              pIVar10 = ImGui::GetIO();
              local_108._4_4_ = local_e8.y + -4.0;
              local_108._0_4_ = (pIVar10->MousePos).x + -10.0;
              local_110.x = 0.0;
              local_110.y = 0.0;
              ImGui::SetNextWindowPos((ImVec2 *)local_108,0,&local_110);
              local_108._0_4_ = 40.0;
              local_108._4_4_ = 0.0;
              ImGui::SetNextWindowSize((ImVec2 *)local_108,0);
              ImGui::BeginTooltip();
              ImGui::Text("%s","");
              ImGui::TextColored(local_d0,"%s","[+]");
              ImGui::Text("%s","");
              uVar8 = (pMVar17->msg).reactUp;
              uVar13 = (ulong)uVar8;
              local_b8 = IVar23;
              if (0 < (int)uVar8) {
                uVar22 = 0;
                lVar16 = 0;
                do {
                  pUVar2 = (local_e0->users).super__Vector_base<User,_std::allocator<User>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  uVar15 = uVar22 % (ulong)(((long)(local_e0->users).
                                                   super__Vector_base<User,_std::allocator<User>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                             (long)pUVar2 >> 5) * -0x5555555555555555);
                  pcVar12 = ",";
                  if (uVar22 == (int)uVar13 - 2) {
                    pcVar12 = " and";
                  }
                  if (uVar22 == (int)uVar13 - 1) {
                    pcVar12 = "";
                  }
                  ImGui::TextColored(local_a0,"%s%s",pUVar2[uVar15].username._M_dataplus._M_p,
                                     pcVar12);
                  lVar16 = (long)(int)lVar16 + pUVar2[uVar15].username._M_string_length;
                  if ((int)lVar16 < 0x14) {
                    ImGui::SameLine(0.0,-1.0);
                  }
                  else {
                    lVar16 = 0;
                  }
                  uVar22 = uVar22 + 1;
                  uVar13 = (ulong)(pMVar17->msg).reactUp;
                } while ((long)uVar22 < (long)uVar13);
              }
              ImGui::Text("reacted with :+1:");
              IVar23 = local_b8;
              ImGui::Text("%s","");
              ImGui::EndTooltip();
            }
            ImGui::SameLine(0.0,-1.0);
            ImGui::Text("%d");
          }
          if (0 < (pMVar17->msg).reactDown) {
            if (0 < (pMVar17->msg).reactUp) {
              ImGui::SameLine(0.0,-1.0);
            }
            ImGui::TextColored(local_d0,"%s","[-]");
            bVar4 = ImGui::IsItemHovered(0);
            if (bVar4) {
              pIVar10 = ImGui::GetIO();
              local_108._4_4_ = local_e8.y + -4.0;
              local_108._0_4_ = (pIVar10->MousePos).x + -10.0;
              local_110.x = 0.0;
              local_110.y = 0.0;
              ImGui::SetNextWindowPos((ImVec2 *)local_108,0,&local_110);
              local_108._0_4_ = 40.0;
              local_108._4_4_ = 0.0;
              ImGui::SetNextWindowSize((ImVec2 *)local_108,0);
              ImGui::BeginTooltip();
              ImGui::Text("%s","");
              ImGui::TextColored(local_d0,"%s","[-]");
              ImGui::Text("%s","");
              uVar8 = (pMVar17->msg).reactDown;
              uVar13 = (ulong)uVar8;
              local_b8 = IVar23;
              if (0 < (int)uVar8) {
                uVar22 = 0;
                lVar16 = 0;
                do {
                  pUVar2 = (local_e0->users).super__Vector_base<User,_std::allocator<User>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  uVar15 = uVar22 % (ulong)(((long)(local_e0->users).
                                                   super__Vector_base<User,_std::allocator<User>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                             (long)pUVar2 >> 5) * -0x5555555555555555);
                  pcVar12 = ",";
                  if (uVar22 == (int)uVar13 - 2) {
                    pcVar12 = " and";
                  }
                  if (uVar22 == (int)uVar13 - 1) {
                    pcVar12 = "";
                  }
                  ImGui::TextColored(local_a0,"%s%s",pUVar2[uVar15].username._M_dataplus._M_p,
                                     pcVar12);
                  lVar16 = (long)(int)lVar16 + pUVar2[uVar15].username._M_string_length;
                  if ((int)lVar16 < 0x14) {
                    ImGui::SameLine(0.0,-1.0);
                  }
                  else {
                    lVar16 = 0;
                  }
                  uVar22 = uVar22 + 1;
                  uVar13 = (ulong)(pMVar17->msg).reactDown;
                } while ((long)uVar22 < (long)uVar13);
              }
              ImGui::Text("reacted with :-1:");
              IVar23 = local_b8;
              ImGui::Text("%s","");
              ImGui::EndTooltip();
            }
            ImGui::SameLine(0.0,-1.0);
            ImGui::Text("%d");
          }
          pMVar14 = (pMVar17->replies).
                    super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar11 = *(pointer *)
                     ((long)&(pMVar17->replies).
                             super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                             ._M_impl + 8);
          if (pMVar11 == pMVar14) {
LAB_00116d74:
            bVar4 = false;
          }
          else {
            if ((0 < (pMVar17->msg).reactUp) || (0 < (pMVar17->msg).reactDown)) {
              ImGui::SameLine(0.0,-1.0);
              ImGui::Text("|");
              ImGui::SameLine(0.0,-1.0);
              pMVar14 = (pMVar17->replies).
                        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar11 = *(pointer *)
                         ((long)&(pMVar17->replies).
                                 super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                 ._M_impl + 8);
            }
            ImGui::TextColored(local_70,"%d replies",
                               (ulong)(uint)((int)((ulong)((long)pMVar11 - (long)pMVar14) >> 3) *
                                            0x38e38e39));
            bVar4 = ImGui::IsItemHovered(0);
            if (!bVar4) goto LAB_00116d74;
            ImGui::SameLine(0.0,-1.0);
            ImGui::SmallButton("View thread");
            bVar4 = ImGui::IsMouseDown(0);
          }
          local_108 = (undefined1  [8])ImGui::GetCursorScreenPos();
          local_110.y = local_e8.y;
          local_110.x = local_c0.x - local_c8;
          ImGui::SetCursorScreenPos(&local_110);
          ImGui::SmallButton("[+]");
          bVar5 = ImGui::IsItemHovered(0);
          if (bVar5) {
            bVar5 = ImGui::IsMouseReleased(0);
            pIVar10 = ImGui::GetIO();
            local_b8 = pIVar10->MousePos;
            uStack_b0._0_1_ = pIVar10->MouseDown[0];
            uStack_b0._1_1_ = pIVar10->MouseDown[1];
            uStack_b0._2_1_ = pIVar10->MouseDown[2];
            uStack_b0._3_1_ = pIVar10->MouseDown[3];
            uStack_b0._4_1_ = pIVar10->MouseDown[4];
            uStack_b0._5_3_ = *(undefined3 *)&pIVar10->field_0x12d;
            pIVar10 = ImGui::GetIO();
            local_110.y = (pIVar10->MousePos).y + -2.0;
            local_110.x = local_b8.x + -10.0;
            local_98.x = 0.0;
            local_98.y = 0.0;
            ImGui::SetNextWindowPos(&local_110,0,&local_98);
            ImGui::SetTooltip("React with +1");
          }
          else {
            bVar5 = false;
          }
          if ((char)local_d4 == '\0') {
            ImGui::SameLine(0.0,-1.0);
            ImGui::SmallButton("[>]");
            bVar6 = ImGui::IsItemHovered(0);
            if (bVar6) {
              bVar6 = ImGui::IsMouseDown(0);
              pIVar10 = ImGui::GetIO();
              local_b8 = pIVar10->MousePos;
              uStack_b0._0_1_ = pIVar10->MouseDown[0];
              uStack_b0._1_1_ = pIVar10->MouseDown[1];
              uStack_b0._2_1_ = pIVar10->MouseDown[2];
              uStack_b0._3_1_ = pIVar10->MouseDown[3];
              uStack_b0._4_1_ = pIVar10->MouseDown[4];
              uStack_b0._5_3_ = *(undefined3 *)&pIVar10->field_0x12d;
              pIVar10 = ImGui::GetIO();
              local_110.y = (pIVar10->MousePos).y + -2.0;
              local_110.x = local_b8.x + -16.0;
              local_98.x = 0.0;
              local_98.y = 0.0;
              ImGui::SetNextWindowPos(&local_110,0,&local_98);
              ImGui::SetTooltip("Reply in thread");
              bVar4 = (bool)(bVar6 | bVar4);
            }
          }
          ImGui::SetCursorScreenPos((ImVec2 *)local_108);
          if (bVar5 == true && (char)local_d4 == '\0') {
            iVar9 = local_e0->selectedChannel;
            piVar1 = (int *)(*(long *)&(local_e0->channels).
                                       super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl
                                       .super__Vector_impl_data._M_start[iVar9].messages.
                                       super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                       ._M_impl.super__Vector_impl_data + 0x28 + local_38 * 8);
            *piVar1 = *piVar1 + 1;
            if (bVar4 != false) goto LAB_00116f28;
          }
          else if (bVar4 != false) {
            iVar9 = local_e0->selectedChannel;
LAB_00116f28:
            local_e0->showThreadPanel = true;
            local_e0->threadChannel = iVar9;
            local_e0->threadMessage = (int)IVar23.x;
          }
        }
      }
      ImGui::PopID();
      fVar18 = (float)(pMVar17->msg).uid;
      IVar23 = (ImVec2)((long)IVar23 + 1);
      pMVar17 = (local_40->
                super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while ((long)IVar23 <
             (long)((int)((ulong)((long)(local_40->
                                        super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar17)
                         >> 3) * 0x38e38e39));
  }
  ImGui::PopTextWrapPos();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool UI::renderMessages(const std::vector<MessageWithReplies> & messages, int width, bool isThread) {
    int32_t lastUid = -1;
    std::string lastDate = "";

    ImGui::PushTextWrapPos(width - 4);

    for (int i = 0; i < (int) messages.size(); i++) {
        const auto & message = messages[i];
        const auto & uid = message.msg.uid;
        const auto & user = users[uid];

        ImGui::PushID(i);

        // render new date separator
        {
            const auto curDate = tToDate(message.msg.t_s);
            if (curDate != lastDate) {
                const auto l = curDate.size() + 6;

                ImGui::Text("%s", "");
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                ImGui::SameLine();
                ImGui::Text("%s", curDate.c_str());
                ImGui::SameLine();
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                lastDate = curDate;
            }
        }

        const auto p0 = ImVec2 { ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y };

        if (lastUid != uid) {
            ImGui::Text("%s", "");
            ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
            ImGui::SameLine();
            ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
        }
        ImGui::Text("%s", message.msg.text.c_str());
        if (message.msg.reactUp > 0) {
            ImGui::TextColored(colors.messageReact, "%s", "[+]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactUp);
        }

        if (message.msg.reactDown > 0) {
            if (message.msg.reactUp > 0) {
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReact, "%s", "[-]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactDown);
        }

        if (message.replies.size() > 0) {
            if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                ImGui::SameLine();
                ImGui::Text("|");
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
        }

        const auto p1 = ImVec2 { ImGui::GetCursorScreenPos().x + width, ImGui::GetCursorScreenPos().y };

        bool doUpvote = false;
        bool doReplyInThead = false;

        if (ImGui::IsWindowHovered() && ImGui::IsMouseHoveringRect(p0, p1)) {
            auto drawList = ImGui::GetWindowDrawList();

            drawList->AddRectFilled({ p0.x, p0.y + 1 }, { p1.x, p1.y - 1 }, ImGui::ColorConvertFloat4ToU32(colors.messageHovered));

            ImGui::SetCursorScreenPos(p0);

            if (lastUid != uid) {
                ImGui::Text("%s", "");
                ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
                ImGui::SameLine();
                ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
            }
            ImGui::Text("%s", message.msg.text.c_str());
            if (message.msg.reactUp > 0) {
                ImGui::TextColored(colors.messageReact, "%s", "[+]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[+]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactUp; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                           i == message.msg.reactUp - 1 ? "" : i == message.msg.reactUp - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :+1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactUp);
            }

            if (message.msg.reactDown > 0) {
                if (message.msg.reactUp > 0) {
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReact, "%s", "[-]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[-]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactDown; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                             i == message.msg.reactDown - 1 ? "" : i == message.msg.reactDown - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :-1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactDown);
            }

            if (message.replies.size() > 0) {
                if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                    ImGui::SameLine();
                    ImGui::Text("|");
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
                if (ImGui::IsItemHovered()) {
                    ImGui::SameLine();
                    ImGui::SmallButton("View thread");
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                }
            }

            auto savePos = ImGui::GetCursorScreenPos();

            const int offsetX = isThread ? 7 : 12;

            ImGui::SetCursorScreenPos({ p1.x - offsetX, p0.y });
            ImGui::SmallButton("[+]");
            if (ImGui::IsItemHovered()) {
                if (ImGui::IsMouseReleased(0)) {
                    doUpvote = true;
                }
                ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, ImGui::GetIO().MousePos.y - 2 });
                ImGui::SetTooltip("React with +1");
            }

            if (!isThread) {
                ImGui::SameLine();
                ImGui::SmallButton("[>]");
                if (ImGui::IsItemHovered()) {
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 16, ImGui::GetIO().MousePos.y - 2 });
                    ImGui::SetTooltip("Reply in thread");
                }
            }

            ImGui::SetCursorScreenPos(savePos);
        }

        if (doUpvote) {
            if (!isThread) {
                channels[selectedChannel].messages[i].msg.reactUp++;
            }
        }

        if (doReplyInThead) {
            showThreadPanel = true;
            threadChannel = selectedChannel;
            threadMessage = i;
        }

        ImGui::PopID();

        lastUid = uid;
    }

    ImGui::PopTextWrapPos();

    return true;
}